

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int type_eq_p(type *type1,type *type2)

{
  type_mode tVar1;
  func_type *pfVar2;
  func_type *pfVar3;
  node_t pnVar4;
  arr_type *paVar5;
  arr_type *paVar6;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  long lVar10;
  decl_spec *pdVar11;
  decl_spec *pdVar12;
  long lVar13;
  node_t_conflict p1;
  node_t_conflict param;
  node_t_conflict p2;
  node_t pnVar14;
  bool bVar15;
  
  while( true ) {
    tVar1 = type1->mode;
    if ((tVar1 != type2->mode) ||
       (((*(byte *)&type2->type_qual ^ *(byte *)&type1->type_qual) & 0xf) != 0)) goto LAB_001893fb;
    if (tVar1 != TM_PTR) break;
    type1 = (type1->u).ptr_type;
    type2 = (type2->u).ptr_type;
  }
  bVar15 = false;
  switch(tVar1) {
  case TM_BASIC:
    bVar15 = (type1->u).basic_type == (type2->u).basic_type;
    goto switchD_00189310_caseD_3;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION:
    bVar15 = (type1->u).tag_type == (type2->u).tag_type;
  default:
    goto switchD_00189310_caseD_3;
  case TM_ARR:
    paVar5 = (type2->u).arr_type;
    paVar6 = (type1->u).arr_type;
    if (((((((*(byte *)paVar5 ^ *(byte *)paVar6) & 1) == 0) &&
          (iVar9 = type_eq_p(paVar6->el_type,paVar5->el_type), iVar9 != 0)) &&
         (((*(byte *)&paVar5->ind_type_qual ^ *(byte *)&paVar6->ind_type_qual) & 0xf) == 0)) &&
        ((paVar6->size->code != N_IGNORE && (paVar5->size->code != N_IGNORE)))) &&
       ((pbVar7 = (byte *)paVar6->size->attr, (*pbVar7 & 1) != 0 &&
        (pbVar8 = (byte *)paVar5->size->attr, (*pbVar8 & 1) != 0)))) {
      iVar9 = *(int *)(*(long *)(pbVar8 + 0x18) + 0x18);
      if ((iVar9 == 2) ||
         ((iVar9 == 1 && (0xfffffff3 < *(int *)(*(long *)(pbVar8 + 0x18) + 0x30) - 0xeU)))) {
        bVar15 = *(long *)(pbVar7 + 0x30) == *(long *)(pbVar8 + 0x30);
        goto switchD_00189310_caseD_3;
      }
    }
    break;
  case TM_FUNC:
    pfVar2 = (type2->u).func_type;
    pfVar3 = (type1->u).func_type;
    if ((((*(byte *)pfVar2 ^ *(byte *)pfVar3) & 1) == 0) &&
       (iVar9 = type_eq_p(pfVar3->ret_type,pfVar2->ret_type), iVar9 != 0)) {
      lVar10 = 0;
      param = (pfVar3->param_list->u).ops.head;
      for (pnVar14 = param; pnVar14 != (node_t_conflict)0x0; pnVar14 = (pnVar14->op_link).next) {
        lVar10 = lVar10 + 1;
      }
      lVar13 = 0;
      pnVar14 = (pfVar2->param_list->u).ops.head;
      for (pnVar4 = pnVar14; pnVar4 != (node_t)0x0; pnVar4 = (pnVar4->op_link).next) {
        lVar13 = lVar13 + 1;
      }
      bVar15 = lVar10 == lVar13;
      if (bVar15) {
        while( true ) {
          if (param == (node_t_conflict)0x0) break;
          pdVar11 = get_param_decl_spec(param);
          pdVar12 = get_param_decl_spec(pnVar14);
          iVar9 = type_eq_p(pdVar11->type,pdVar12->type);
          bVar15 = iVar9 != 0;
          if (iVar9 == 0) break;
          param = (param->op_link).next;
          pnVar14 = (pnVar14->op_link).next;
        }
      }
      goto switchD_00189310_caseD_3;
    }
  }
LAB_001893fb:
  bVar15 = false;
switchD_00189310_caseD_3:
  return (int)bVar15;
}

Assistant:

static int type_eq_p (struct type *type1, struct type *type2) {
  if (type1->mode != type2->mode) return FALSE;
  if (!type_qual_eq_p (&type1->type_qual, &type2->type_qual)) return FALSE;
  switch (type1->mode) {
  case TM_BASIC: return type1->u.basic_type == type2->u.basic_type;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: return type1->u.tag_type == type2->u.tag_type;
  case TM_PTR: return type_eq_p (type1->u.ptr_type, type2->u.ptr_type);
  case TM_ARR: {
    struct expr *cexpr1, *cexpr2;
    struct arr_type *at1 = type1->u.arr_type, *at2 = type2->u.arr_type;

    return (at1->static_p == at2->static_p && type_eq_p (at1->el_type, at2->el_type)
            && type_qual_eq_p (&at1->ind_type_qual, &at2->ind_type_qual)
            && at1->size->code != N_IGNORE && at2->size->code != N_IGNORE
            && (cexpr1 = at1->size->attr)->const_p && (cexpr2 = at2->size->attr)->const_p
            && integer_type_p (cexpr2->type) && integer_type_p (cexpr2->type)
            && cexpr1->c.i_val == cexpr2->c.i_val);
  }
  case TM_FUNC: {
    struct func_type *ft1 = type1->u.func_type, *ft2 = type2->u.func_type;
    struct decl_spec *ds1, *ds2;

    if (ft1->dots_p != ft2->dots_p || !type_eq_p (ft1->ret_type, ft2->ret_type)
        || NL_LENGTH (ft1->param_list->u.ops) != NL_LENGTH (ft2->param_list->u.ops))
      return FALSE;
    for (node_t p1 = NL_HEAD (ft1->param_list->u.ops), p2 = NL_HEAD (ft2->param_list->u.ops);
         p1 != NULL; p1 = NL_NEXT (p1), p2 = NL_NEXT (p2)) {
      ds1 = get_param_decl_spec (p1);
      ds2 = get_param_decl_spec (p2);
      if (!type_eq_p (ds1->type, ds2->type)) return FALSE;
      // ??? other qualifiers
    }
    return TRUE;
  }
  default: return FALSE;
  }
}